

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O2

void cjson_minify_should_remove_spaces(void)

{
  char *json;
  
  json = (char *)malloc(0x15);
  if (json == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x3f);
  }
  builtin_strncpy(json,"{ \"key\":\ttrue\r\n    }",0x15);
  cJSON_Minify(json);
  UnityAssertEqualString("{\"key\":true}",json,(char *)0x0,0x43);
  free(json);
  return;
}

Assistant:

static void cjson_minify_should_remove_spaces(void)
{
    const char to_minify[] = "{ \"key\":\ttrue\r\n    }";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{\"key\":true}", minified);

    free(minified);
}